

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PArray * NewArray(PType *type,uint count)

{
  size_t in_RAX;
  PArray *this;
  size_t bucket;
  size_t local_28;
  
  local_28 = in_RAX;
  this = (PArray *)
         FTypeTable::FindType
                   (&TypeTable,PArray::RegistrationInfo.MyClass,(intptr_t)type,(ulong)count,
                    &local_28);
  if (this == (PArray *)0x0) {
    this = (PArray *)DObject::operator_new(0xa8);
    PArray::PArray(this,type,count);
    FTypeTable::AddType(&TypeTable,(PType *)this,PArray::RegistrationInfo.MyClass,(intptr_t)type,
                        (ulong)count,local_28);
  }
  return this;
}

Assistant:

PArray *NewArray(PType *type, unsigned int count)
{
	size_t bucket;
	PType *atype = TypeTable.FindType(RUNTIME_CLASS(PArray), (intptr_t)type, count, &bucket);
	if (atype == NULL)
	{
		atype = new PArray(type, count);
		TypeTable.AddType(atype, RUNTIME_CLASS(PArray), (intptr_t)type, count, bucket);
	}
	return (PArray *)atype;
}